

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<int,_QEvdevTouchScreenData::Contact> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::findNode<int>
          (Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *this,int *key)

{
  ulong uVar1;
  Node<int,_QEvdevTouchScreenData::Contact> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<int>(this,key);
  uVar1 = (ulong)(BVar3.span)->offsets[BVar3.index];
  if (uVar1 == 0xff) {
    pNVar2 = (Node<int,_QEvdevTouchScreenData::Contact> *)0x0;
  }
  else {
    pNVar2 = (Node<int,_QEvdevTouchScreenData::Contact> *)((BVar3.span)->entries + uVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }